

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::interecursive
          (tetgenmesh *this,shellface **subfacearray,int arraysize,int axis,double bxmin,
          double bxmax,double bymin,double bymax,double bzmin,double bzmax,int *internum)

{
  shellface A;
  shellface B;
  shellface C;
  shellface O;
  shellface P;
  shellface Q;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  shellface **subfacearray_00;
  shellface **subfacearray_01;
  shellface ppdVar12;
  undefined4 uVar13;
  char *local_130;
  char *local_128;
  int local_dc;
  int local_d8;
  int j;
  int i;
  int rightsize;
  int leftsize;
  bool toright;
  bool toleft;
  double split;
  interresult intersect;
  point p6;
  point p5;
  point p4;
  point p3;
  point p2;
  point p1;
  face sface2;
  face sface1;
  shellface **rightarray;
  shellface **leftarray;
  int *internum_local;
  double bzmax_local;
  double bzmin_local;
  double bymax_local;
  double bymin_local;
  double bxmax_local;
  double bxmin_local;
  int axis_local;
  int arraysize_local;
  shellface **subfacearray_local;
  tetgenmesh *this_local;
  
  face::face((face *)&sface2.shver);
  face::face((face *)&p1);
  if (2 < this->b->verbose) {
    if (axis == 0) {
      local_128 = "x";
    }
    else {
      if (axis == 1) {
        local_130 = "y";
      }
      else {
        local_130 = "z";
      }
      local_128 = local_130;
    }
    printf("      Recur %d faces. Bbox (%g, %g, %g),(%g, %g, %g). %s-axis\n",bxmin,bymin,bzmin,bxmax
           ,bymax,bzmax,(ulong)(uint)arraysize,local_128);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)arraysize;
  uVar11 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  subfacearray_00 = (shellface **)operator_new__(uVar11);
  if (subfacearray_00 == (shellface **)0x0) {
    terminatetetgen(this,1);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)arraysize;
  uVar11 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  subfacearray_01 = (shellface **)operator_new__(uVar11);
  if (subfacearray_01 == (shellface **)0x0) {
    terminatetetgen(this,1);
  }
  j = 0;
  i = 0;
  if (axis == 0) {
    _leftsize = bxmin + bxmax;
  }
  else if (axis == 1) {
    _leftsize = bymin + bymax;
  }
  else {
    _leftsize = bzmin + bzmax;
  }
  _leftsize = _leftsize * 0.5;
  for (local_d8 = 0; local_d8 < arraysize; local_d8 = local_d8 + 1) {
    sface2._8_8_ = subfacearray[local_d8];
    bVar4 = false;
    bVar3 = false;
    if (_leftsize <= (double)(*(shellface *)(sface2._8_8_ + 0x18))[axis]) {
      if ((double)(*(shellface *)(sface2._8_8_ + 0x18))[axis] <= _leftsize) {
        bVar3 = true;
      }
      else if (((double)(*(shellface *)(sface2._8_8_ + 0x20))[axis] <= _leftsize) ||
              ((double)(*(shellface *)(sface2._8_8_ + 0x28))[axis] <= _leftsize)) {
        bVar3 = true;
      }
      bVar4 = true;
    }
    else {
      bVar3 = true;
      if ((_leftsize <= (double)(*(shellface *)(sface2._8_8_ + 0x20))[axis]) ||
         (_leftsize <= (double)(*(shellface *)(sface2._8_8_ + 0x28))[axis])) {
        bVar4 = true;
      }
    }
    if (bVar3) {
      subfacearray_00[i] = (shellface *)sface2._8_8_;
      i = i + 1;
    }
    if (bVar4) {
      subfacearray_01[j] = (shellface *)sface2._8_8_;
      j = j + 1;
    }
  }
  if ((i < arraysize) && (j < arraysize)) {
    if (subfacearray != (shellface **)0x0) {
      operator_delete__(subfacearray);
    }
    if (axis == 0) {
      interecursive(this,subfacearray_00,i,1,bxmin,_leftsize,bymin,bymax,bzmin,bzmax,internum);
      interecursive(this,subfacearray_01,j,1,_leftsize,bxmax,bymin,bymax,bzmin,bzmax,internum);
    }
    else if (axis == 1) {
      interecursive(this,subfacearray_00,i,2,bxmin,bxmax,bymin,_leftsize,bzmin,bzmax,internum);
      interecursive(this,subfacearray_01,j,2,bxmin,bxmax,_leftsize,bymax,bzmin,bzmax,internum);
    }
    else {
      interecursive(this,subfacearray_00,i,0,bxmin,bxmax,bymin,bymax,bzmin,_leftsize,internum);
      interecursive(this,subfacearray_01,j,0,bxmin,bxmax,bymin,bymax,_leftsize,bzmax,internum);
    }
  }
  else {
    if (1 < this->b->verbose) {
      printf("  Checking intersecting faces.\n");
    }
    for (local_d8 = 0; local_d8 < arraysize; local_d8 = local_d8 + 1) {
      sface2._8_8_ = subfacearray[local_d8];
      A = *(shellface *)(sface2._8_8_ + 0x18);
      B = *(shellface *)(sface2._8_8_ + 0x20);
      C = *(shellface *)(sface2._8_8_ + 0x28);
      local_dc = local_d8;
      while (local_dc = local_dc + 1, local_dc < arraysize) {
        p1 = (point)subfacearray[local_dc];
        O = ((shellface *)p1)[3];
        P = ((shellface *)p1)[4];
        Q = ((shellface *)p1)[5];
        ppdVar12 = Q;
        iVar5 = tri_tri_inter(this,(double *)A,(double *)B,(double *)C,(double *)O,(double *)P,
                              (double *)Q);
        uVar13 = (undefined4)((ulong)ppdVar12 >> 0x20);
        if ((iVar5 == 1) || (iVar5 == 4)) {
          if (this->b->quiet == 0) {
            if (iVar5 == 1) {
              uVar6 = shellmark(this,(face *)&sface2.shver);
              uVar7 = shellmark(this,(face *)&p1);
              printf("  Facet #%d intersects facet #%d at triangles:\n",(ulong)uVar6,(ulong)uVar7);
              uVar6 = pointmark(this,(point)A);
              uVar7 = pointmark(this,(point)B);
              uVar8 = pointmark(this,(point)C);
              uVar9 = pointmark(this,(point)O);
              uVar10 = pointmark(this,(point)P);
              iVar5 = pointmark(this,(point)Q);
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",(ulong)uVar6,(ulong)uVar7,
                     (ulong)uVar8,(ulong)uVar9,(ulong)uVar10,CONCAT44(uVar13,iVar5));
            }
            else {
              uVar6 = shellmark(this,(face *)&sface2.shver);
              uVar7 = shellmark(this,(face *)&p1);
              printf("  Facet #%d duplicates facet #%d at triangle:\n",(ulong)uVar6,(ulong)uVar7);
              uVar6 = pointmark(this,(point)A);
              uVar7 = pointmark(this,(point)B);
              uVar8 = pointmark(this,(point)C);
              uVar9 = pointmark(this,(point)O);
              uVar10 = pointmark(this,(point)P);
              iVar5 = pointmark(this,(point)Q);
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",(ulong)uVar6,(ulong)uVar7,
                     (ulong)uVar8,(ulong)uVar9,(ulong)uVar10,CONCAT44(uVar13,iVar5));
            }
          }
          *internum = *internum + 1;
          sinfect(this,(face *)&sface2.shver);
          sinfect(this,(face *)&p1);
        }
      }
    }
    if (subfacearray_00 != (shellface **)0x0) {
      operator_delete__(subfacearray_00);
    }
    if (subfacearray_01 != (shellface **)0x0) {
      operator_delete__(subfacearray_01);
    }
    if (subfacearray != (shellface **)0x0) {
      operator_delete__(subfacearray);
    }
  }
  return;
}

Assistant:

void tetgenmesh::interecursive(shellface** subfacearray, int arraysize, 
                               int axis, REAL bxmin, REAL bxmax, REAL bymin, 
                               REAL bymax, REAL bzmin, REAL bzmax, 
                               int* internum)
{
  shellface **leftarray, **rightarray;
  face sface1, sface2;
  point p1, p2, p3;
  point p4, p5, p6;
  enum interresult intersect;
  REAL split;
  bool toleft, toright;
  int leftsize, rightsize;
  int i, j;

  if (b->verbose > 2) {
    printf("      Recur %d faces. Bbox (%g, %g, %g),(%g, %g, %g). %s-axis\n",
           arraysize, bxmin, bymin, bzmin, bxmax, bymax, bzmax,
           axis == 0 ? "x" : (axis == 1 ? "y" : "z"));
  }
    
  leftarray = new shellface*[arraysize];
  if (leftarray == NULL) {
    terminatetetgen(this, 1);
  }
  rightarray = new shellface*[arraysize];
  if (rightarray == NULL) {
    terminatetetgen(this, 1);
  }
  leftsize = rightsize = 0;

  if (axis == 0) {
    // Split along x-axis.
    split = 0.5 * (bxmin + bxmax);
  } else if (axis == 1) {
    // Split along y-axis.
    split = 0.5 * (bymin + bymax);
  } else {
    // Split along z-axis.
    split = 0.5 * (bzmin + bzmax);
  }

  for (i = 0; i < arraysize; i++) {
    sface1.sh = subfacearray[i];
    p1 = (point) sface1.sh[3];
    p2 = (point) sface1.sh[4];
    p3 = (point) sface1.sh[5];
    toleft = toright = false;
    if (p1[axis] < split) {
      toleft = true;
      if (p2[axis] >= split || p3[axis] >= split) {
        toright = true;
      } 
    } else if (p1[axis] > split) {
      toright = true;
      if (p2[axis] <= split || p3[axis] <= split) {
        toleft = true;
      } 
    } else {
      // p1[axis] == split;
      toleft = true;
      toright = true;
    }
    if (toleft) {
      leftarray[leftsize] = sface1.sh;
      leftsize++;
    }
    if (toright) {
      rightarray[rightsize] = sface1.sh;
      rightsize++;
    }
  }

  if (leftsize < arraysize && rightsize < arraysize) {
    // Continue to partition the input set. Now 'subfacearray' has been
    //   split into two sets, it's memory can be freed. 'leftarray' and
    //   'rightarray' will be freed in the next recursive (after they're
    //   partitioned again or performing tests).
    delete [] subfacearray;
    // Continue to split these two sets.
    if (axis == 0) {
      interecursive(leftarray, leftsize, 1, bxmin, split, bymin, bymax,
                    bzmin, bzmax, internum);
      interecursive(rightarray, rightsize, 1, split, bxmax, bymin, bymax,
                    bzmin, bzmax, internum);
    } else if (axis == 1) {
      interecursive(leftarray, leftsize, 2, bxmin, bxmax, bymin, split,
                    bzmin, bzmax, internum);
      interecursive(rightarray, rightsize, 2, bxmin, bxmax, split, bymax,
                    bzmin, bzmax, internum);
    } else {
      interecursive(leftarray, leftsize, 0, bxmin, bxmax, bymin, bymax,
                    bzmin, split, internum);
      interecursive(rightarray, rightsize, 0, bxmin, bxmax, bymin, bymax,
                    split, bzmax, internum);
    }
  } else {
    if (b->verbose > 1) {
      printf("  Checking intersecting faces.\n");
    }
    // Perform a brute-force compare on the set.
    for (i = 0; i < arraysize; i++) {
      sface1.sh = subfacearray[i];
      p1 = (point) sface1.sh[3];
      p2 = (point) sface1.sh[4];
      p3 = (point) sface1.sh[5];
      for (j = i + 1; j < arraysize; j++) {
        sface2.sh = subfacearray[j];
        p4 = (point) sface2.sh[3];
        p5 = (point) sface2.sh[4];
        p6 = (point) sface2.sh[5];
        intersect = (enum interresult) tri_tri_inter(p1, p2, p3, p4, p5, p6);
        if (intersect == INTERSECT || intersect == SHAREFACE) {
          if (!b->quiet) {
            if (intersect == INTERSECT) {
              printf("  Facet #%d intersects facet #%d at triangles:\n",
                     shellmark(sface1), shellmark(sface2));
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                     pointmark(p1), pointmark(p2), pointmark(p3),
                     pointmark(p4), pointmark(p5), pointmark(p6));
            } else {
              printf("  Facet #%d duplicates facet #%d at triangle:\n",
                     shellmark(sface1), shellmark(sface2));
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                     pointmark(p1), pointmark(p2), pointmark(p3),
                     pointmark(p4), pointmark(p5), pointmark(p6));
            }
          }
          // Increase the number of intersecting pairs.
          (*internum)++; 
          // Infect these two faces (although they may already be infected).
          sinfect(sface1);
          sinfect(sface2);
        }
      }
    }
    // Don't forget to free all three arrays. No further partition.
    delete [] leftarray;
    delete [] rightarray;  
    delete [] subfacearray;
  }
}